

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O0

void __thiscall
Js::JavascriptBigInt::MulThenAdd(JavascriptBigInt *this,digit_t digitMul,digit_t digitAdd)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  unsigned_long **ppuVar5;
  unsigned_long *puVar6;
  digit_t dVar7;
  digit_t *pDigitLimit;
  digit_t *pDigit;
  digit_t carryDigit;
  digit_t digitAdd_local;
  digit_t digitMul_local;
  JavascriptBigInt *this_local;
  
  carryDigit = digitAdd;
  digitAdd_local = digitMul;
  digitMul_local = (digit_t)this;
  if (digitMul == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x166,"(digitMul != 0)","digitMul != 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pDigit = (digit_t *)0x0;
  ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                      ((WriteBarrierPtr *)&this->m_digits);
  pDigitLimit = *ppuVar5;
  puVar6 = pDigitLimit + this->m_length;
  for (; pDigitLimit < puVar6; pDigitLimit = pDigitLimit + 1) {
    dVar7 = MulDigit(*pDigitLimit,digitAdd_local,(digit_t *)&pDigit);
    *pDigitLimit = dVar7;
    if (carryDigit != 0) {
      dVar7 = AddDigit(*pDigitLimit,carryDigit,(digit_t *)&pDigit);
      *pDigitLimit = dVar7;
    }
    carryDigit = (digit_t)pDigit;
  }
  if (carryDigit != 0) {
    if (this->m_maxLength <= this->m_length) {
      Resize(this,this->m_length + 1);
    }
    dVar7 = carryDigit;
    ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                        ((WriteBarrierPtr *)&this->m_digits);
    puVar6 = *ppuVar5;
    TVar1 = this->m_length;
    this->m_length = TVar1 + 1;
    puVar6[TVar1] = dVar7;
  }
  return;
}

Assistant:

void JavascriptBigInt::MulThenAdd(digit_t digitMul, digit_t digitAdd)
    {
        Assert(digitMul != 0);

        digit_t carryDigit = 0;
        digit_t *pDigit = m_digits;
        digit_t *pDigitLimit = pDigit + m_length;

        for (; pDigit < pDigitLimit; pDigit++)
        {
            *pDigit = JavascriptBigInt::MulDigit(*pDigit, digitMul, &carryDigit);// return low Digit to digit, hight Digit to carry
            if (digitAdd > 0)
            {
                *pDigit = JavascriptBigInt::AddDigit(*pDigit, digitAdd, &carryDigit);// add carry to result
            }
            digitAdd = carryDigit;
        }
        if (0 < digitAdd) // length increase by 1
        {
            if (m_length >= m_maxLength)
            {
                Resize(m_length + 1);
            }
            m_digits[m_length++] = digitAdd;
        }
    }